

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.h
# Opt level: O0

ListEntry __thiscall
SortedList<MessageQueue::ListEntry>::Pop(SortedList<MessageQueue::ListEntry> *this)

{
  ulong uVar1;
  MessageBase *pMVar2;
  ListEntry LVar3;
  SortedList<MessageQueue::ListEntry> *this_local;
  ListEntry data;
  
  uVar1 = *(ulong *)&this->head->data;
  pMVar2 = (this->head->data).message;
  Remove(this,this->head);
  LVar3._0_8_ = uVar1 & 0xffffffff;
  LVar3.message = pMVar2;
  return LVar3;
}

Assistant:

T Pop()
    {
        T data = head->data;
        Remove(head);
        return data;
    }